

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O0

void __thiscall ViewTest::coordinatesToIndexTest<true>(ViewTest *this)

{
  allocator<int> *paVar1;
  undefined1 *this_00;
  ulong uVar2;
  reference pvVar3;
  iterator it;
  bool local_199;
  unsigned_long *local_198;
  size_t local_190;
  size_t index_1;
  size_t trueIndex_1;
  undefined1 local_178 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> c_1;
  CoordinateOrder local_158 [2];
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_150;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_148;
  undefined1 local_140 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_1;
  undefined1 local_f8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_1;
  size_t local_d0;
  size_t index;
  size_t trueIndex;
  undefined1 local_b8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> c;
  CoordinateOrder local_98 [2];
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_90;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_88;
  undefined1 local_80 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v;
  allocator<unsigned_long> local_29;
  undefined1 local_28 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  ViewTest *this_local;
  
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<unsigned_long>::allocator(&local_29);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,3,&local_29);
  std::allocator<unsigned_long>::~allocator(&local_29);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,0);
  *pvVar3 = 3;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,1);
  *pvVar3 = 2;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,2);
  *pvVar3 = 4;
  local_88._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  local_90._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  local_98[1] = 1;
  local_98[0] = LastMajorOrder;
  paVar1 = (allocator<int> *)
           ((long)&c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_80,local_88,local_90,this->data_,
             local_98 + 1,local_98,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&trueIndex + 7));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8,3,
             (allocator<unsigned_long> *)((long)&trueIndex + 7));
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&trueIndex + 7));
  index = 0;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8,2);
  *pvVar3 = 0;
  while( true ) {
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8,2);
    uVar2 = *pvVar3;
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,2);
    if (*pvVar3 <= uVar2) break;
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8,1);
    *pvVar3 = 0;
    while( true ) {
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8,1);
      uVar2 = *pvVar3;
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,1);
      if (*pvVar3 <= uVar2) break;
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8,0);
      *pvVar3 = 0;
      while( true ) {
        pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8,0);
        uVar2 = *pvVar3;
        pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,0);
        if (*pvVar3 <= uVar2) break;
        local_d0 = 100;
        it = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8);
        andres::View<int,true,std::allocator<unsigned_long>>::
        coordinatesToIndex<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                  ((View<int,true,std::allocator<unsigned_long>> *)local_80,
                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )it._M_current,&local_d0);
        shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = local_d0 == index;
        test((bool *)((long)&shape_1.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        index = index + 1;
        pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8,0);
        *pvVar3 = *pvVar3 + 1;
      }
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8,1);
      *pvVar3 = *pvVar3 + 1;
    }
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8,2);
    *pvVar3 = *pvVar3 + 1;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_80);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  this_00 = &v_1.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)this_00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f8,3,
             (allocator_type *)this_00);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_1.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f8,0);
  *pvVar3 = 3;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f8,1);
  *pvVar3 = 2;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f8,2);
  *pvVar3 = 4;
  local_148._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f8);
  local_150._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f8);
  local_158[1] = 1;
  local_158[0] = FirstMajorOrder;
  paVar1 = (allocator<int> *)
           ((long)&c_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_140,local_148,local_150,
             this->data_,local_158 + 1,local_158,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&c_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&trueIndex_1 + 7));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_178,3,
             (allocator<unsigned_long> *)((long)&trueIndex_1 + 7));
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&trueIndex_1 + 7));
  index_1 = 0;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_178,0);
  *pvVar3 = 0;
  while( true ) {
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_178,0);
    uVar2 = *pvVar3;
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f8,0);
    if (*pvVar3 <= uVar2) break;
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_178,1);
    *pvVar3 = 0;
    while( true ) {
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_178,1);
      uVar2 = *pvVar3;
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f8,1);
      if (*pvVar3 <= uVar2) break;
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_178,2);
      *pvVar3 = 0;
      while( true ) {
        pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_178,2);
        uVar2 = *pvVar3;
        pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f8,2);
        if (*pvVar3 <= uVar2) break;
        local_190 = 100;
        local_198 = (unsigned_long *)
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_178);
        andres::View<int,true,std::allocator<unsigned_long>>::
        coordinatesToIndex<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                  ((View<int,true,std::allocator<unsigned_long>> *)local_140,
                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )local_198,&local_190);
        local_199 = local_190 == index_1;
        test(&local_199);
        index_1 = index_1 + 1;
        pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_178,2);
        *pvVar3 = *pvVar3 + 1;
      }
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_178,1);
      *pvVar3 = *pvVar3 + 1;
    }
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_178,0);
    *pvVar3 = *pvVar3 + 1;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_178);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_140);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f8);
  return;
}

Assistant:

void ViewTest::coordinatesToIndexTest() {
    // internalFirstMajorOrder == false
    {
        std::vector<std::size_t> shape(3);
        shape[0] = 3;
        shape[1] = 2;
        shape[2] = 4;
        andres::View<int, constTarget> v(shape.begin(), shape.end(),
            data_, andres::LastMajorOrder, andres::LastMajorOrder);

        std::vector<std::size_t> c(3);
        std::size_t trueIndex = 0;
        for(c[2]=0; c[2]<shape[2]; ++c[2]) 
        for(c[1]=0; c[1]<shape[1]; ++c[1])
        for(c[0]=0; c[0]<shape[0]; ++c[0]) {
            std::size_t index = 100;
            v.coordinatesToIndex(c.begin(), index);
            test(index == trueIndex);
            ++trueIndex;
        }
    }
    // internalFirstMajorOrder == true
    {
        std::vector<std::size_t> shape(3);
        shape[0] = 3;
        shape[1] = 2;
        shape[2] = 4;
        andres::View<int, constTarget> v(shape.begin(), shape.end(),
            data_, andres::LastMajorOrder, andres::FirstMajorOrder);

        std::vector<std::size_t> c(3);
        std::size_t trueIndex = 0;
        for(c[0]=0; c[0]<shape[0]; ++c[0]) 
        for(c[1]=0; c[1]<shape[1]; ++c[1])
        for(c[2]=0; c[2]<shape[2]; ++c[2]) {
            std::size_t index = 100;
            v.coordinatesToIndex(c.begin(), index);
            test(index == trueIndex);
            ++trueIndex;
        }
    }
}